

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int h264_macroblock_layer
              (bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint mb_type;
  h264_seqparm *phVar1;
  h264_picparm *phVar2;
  bool bVar3;
  int iVar4;
  uint32_t ival;
  ulong uVar5;
  uint32_t uVar6;
  uint32_t *puVar7;
  long lVar8;
  
  phVar1 = slice->seqparm;
  phVar2 = slice->picparm;
  puVar7 = &mb->mb_type;
  iVar4 = h264_mb_type(str,cabac,slice->slice_type,puVar7);
  if (iVar4 != 0) goto LAB_00103b23;
  uVar5 = (ulong)*puVar7;
  if (0x37 < uVar5) goto LAB_00103dc8;
  if ((0x800000c0000000U >> (uVar5 & 0x3f) & 1) == 0) {
    if ((0x4000001UL >> (uVar5 & 0x3f) & 1) != 0) {
      if (phVar2->transform_8x8_mode_flag == 0) {
        iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
      }
      else {
        iVar4 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
      }
      if (iVar4 != 0) goto LAB_00103b23;
LAB_00103dc8:
      iVar4 = h264_mb_pred(str,cabac,slice,mb);
      bVar3 = true;
      goto LAB_00103de4;
    }
    if (uVar5 != 0x19) goto LAB_00103dc8;
    iVar4 = vs_align_byte(str,VS_ALIGN_0);
    if (iVar4 != 0) goto LAB_00103b23;
    lVar8 = 0x14;
    do {
      iVar4 = vs_u(str,(uint32_t *)((long)mb->pcm_sample_luma + lVar8 + -0x14),
                   slice->bit_depth_luma_minus8 + 8);
      if (iVar4 != 0) goto LAB_00103b23;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x414);
    if ((slice->chroma_array_type != 0) && (0 < 0x40 << ((byte)slice->chroma_array_type & 0x1f))) {
      puVar7 = mb->pcm_sample_chroma;
      lVar8 = 0;
      do {
        iVar4 = vs_u(str,puVar7,slice->bit_depth_chroma_minus8 + 8);
        if (iVar4 != 0) goto LAB_00103b23;
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + 1;
      } while (lVar8 < 0x40 << ((byte)slice->chroma_array_type & 0x1f));
    }
    if (((((cabac != (h264_cabac_context *)0x0) &&
          (iVar4 = h264_cabac_init_arith(str,cabac), iVar4 != 0)) ||
         (iVar4 = vs_infers(str,&mb->mb_qp_delta,0), iVar4 != 0)) ||
        ((iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0), iVar4 != 0 ||
         (iVar4 = vs_infer(str,&mb->coded_block_pattern,0x2f), iVar4 != 0)))) ||
       (iVar4 = vs_infer(str,&mb->intra_chroma_pred_mode,0), iVar4 != 0)) goto LAB_00103b23;
    iVar4 = infer_intra(str,mb,0);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = infer_intra(str,mb,1);
    if (iVar4 != 0) {
      return 1;
    }
    lVar8 = -0x11;
    do {
      mb->coded_block_flag[1][lVar8] = 1;
      mb->coded_block_flag[2][lVar8] = 1;
      mb[1].pcm_sample_luma[lVar8 + -5] = 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    lVar8 = -0x10;
    do {
      mb->total_coeff[1][lVar8] = 0x10;
      *(int *)((long)(mb->coded_block_flag + -1) + (lVar8 + 1) * 4) = 0x10;
      mb->coded_block_flag[0][lVar8] = 0x10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
LAB_00103f65:
    iVar4 = 0;
  }
  else {
    iVar4 = h264_sub_mb_pred(str,cabac,slice,mb);
    if (iVar4 != 0) goto LAB_00103b23;
    bVar3 = true;
    lVar8 = 0;
    do {
      if ((ulong)mb->sub_mb_type[lVar8] == 4) {
        if (phVar1->direct_8x8_inference_flag == 0) {
          bVar3 = false;
        }
      }
      else if (sub_mb_part_info[mb->sub_mb_type[lVar8]][0] != 0) {
        bVar3 = false;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    iVar4 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
LAB_00103de4:
    if (iVar4 != 0) {
      return 1;
    }
    mb_type = *puVar7;
    if (((mb_type == 0) || (mb_type == 0x1a)) || (0x19 < mb_type)) {
      iVar4 = h264_coded_block_pattern
                        (str,cabac,mb_type,(uint)(slice->chroma_array_type - 1 < 2),
                         &mb->coded_block_pattern);
      if (iVar4 == 0) {
        if (0x19 < *puVar7) {
          if ((((mb->coded_block_pattern & 0xf) == 0) || (phVar2->transform_8x8_mode_flag == 0)) ||
             ((!bVar3 || ((*puVar7 == 0x21 && (phVar1->direct_8x8_inference_flag == 0))))))
          goto LAB_00103edb;
          iVar4 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
          goto LAB_00103ee2;
        }
LAB_00103eea:
        if ((mb->coded_block_pattern == 0) && (*puVar7 - 0x19 < 0xffffffe8)) {
          iVar4 = vs_infers(str,&mb->mb_qp_delta,0);
        }
        else {
          iVar4 = h264_mb_qp_delta(str,cabac,&mb->mb_qp_delta);
        }
        if (iVar4 == 0) {
          iVar4 = h264_residual(str,cabac,slice,mb,0,0xf);
          if (iVar4 != 0) {
            return 1;
          }
          goto LAB_00103f65;
        }
      }
    }
    else {
      uVar6 = ((mb_type - 1 >> 2) % 3) * 0x10;
      ival = uVar6 + 0xf;
      if (mb_type < 0xd) {
        ival = uVar6;
      }
      iVar4 = vs_infer(str,&mb->coded_block_pattern,ival);
      if (iVar4 == 0) {
LAB_00103edb:
        iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
LAB_00103ee2:
        if (iVar4 == 0) goto LAB_00103eea;
      }
    }
LAB_00103b23:
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int h264_macroblock_layer(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	struct h264_picparm *picparm = slice->picparm;
	struct h264_seqparm *seqparm = slice->seqparm;
	if (h264_mb_type(str, cabac, slice->slice_type, &mb->mb_type)) return 1;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		if (vs_align_byte(str, VS_ALIGN_0)) return 1;
		int i;
		for (i = 0; i < 256; i++)
			if (vs_u(str, &mb->pcm_sample_luma[i], slice->bit_depth_luma_minus8 + 8)) return 1;
		if (slice->chroma_array_type) {
			for (i = 0; i < (64 << slice->chroma_array_type); i++)
				if (vs_u(str, &mb->pcm_sample_chroma[i], slice->bit_depth_chroma_minus8 + 8)) return 1;
		}
		if (cabac)
			if (h264_cabac_init_arith(str, cabac)) return 1;
		if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		if (vs_infer(str, &mb->coded_block_pattern, 0x2f)) return 1;
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
		for (i = 0; i < 17; i++) {
			mb->coded_block_flag[0][i] = 1;
			mb->coded_block_flag[1][i] = 1;
			mb->coded_block_flag[2][i] = 1;
		}
		for (i = 0; i < 16; i++) {
			mb->total_coeff[0][i] = 16;
			mb->total_coeff[1][i] = 16;
			mb->total_coeff[2][i] = 16;
		}
	} else {
		int noSubMbPartSizeLessThan8x8Flag = 1;
		if (h264_is_submb_mb_type(mb->mb_type)) {
			if (h264_sub_mb_pred(str, cabac, slice, mb)) return 1;
			int i;
			for (i = 0; i < 4; i++) {
				if (mb->sub_mb_type[i] != H264_SUB_MB_TYPE_B_DIRECT_8X8) {
					if (sub_mb_part_info[mb->sub_mb_type[i]][0])
						noSubMbPartSizeLessThan8x8Flag = 0;
				} else {
					if (!seqparm->direct_8x8_inference_flag)
						noSubMbPartSizeLessThan8x8Flag = 0;
				}
			}
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		} else {
			if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
				if (picparm->transform_8x8_mode_flag) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
			if (h264_mb_pred(str, cabac, slice, mb)) return 1;
		}
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI || mb->mb_type >= H264_MB_TYPE_I_END) {
			int has_chroma = slice->chroma_array_type < 3 && slice->chroma_array_type != 0;
			if (h264_coded_block_pattern(str, cabac, mb->mb_type, has_chroma, &mb->coded_block_pattern)) return 1;
			if (mb->mb_type >= H264_MB_TYPE_I_END) {
				if ((mb->coded_block_pattern & 0xf) && picparm->transform_8x8_mode_flag && noSubMbPartSizeLessThan8x8Flag && (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16 || seqparm->direct_8x8_inference_flag)) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
		} else {
			int infer_cbp = (((mb->mb_type - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
			if (mb->mb_type >= H264_MB_TYPE_I_16X16_0_0_1)
				infer_cbp |= 0xf;
			if (vs_infer(str, &mb->coded_block_pattern, infer_cbp)) return 1;
			if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		}
		if (mb->coded_block_pattern || h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (h264_mb_qp_delta(str, cabac, &mb->mb_qp_delta)) return 1;
		} else {
			if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		}
		if (h264_residual(str, cabac, slice, mb, 0, 15)) return 1;
	}
	return 0;
}